

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeListImpl.cpp
# Opt level: O0

DOMNode * __thiscall xercesc_4_0::DOMNodeListImpl::item(DOMNodeListImpl *this,XMLSize_t index)

{
  DOMChildNode *pDVar1;
  ulong local_30;
  XMLSize_t i;
  DOMNode *node;
  XMLSize_t index_local;
  DOMNodeListImpl *this_local;
  
  if (this->fNode == (DOMParentNode *)0x0) {
    this_local = (DOMNodeListImpl *)0x0;
  }
  else {
    i = (XMLSize_t)this->fNode->fFirstChild;
    for (local_30 = 0; local_30 < index && i != 0; local_30 = local_30 + 1) {
      pDVar1 = castToChildImpl((DOMNode *)i);
      i = (XMLSize_t)pDVar1->nextSibling;
    }
    this_local = (DOMNodeListImpl *)i;
  }
  return (DOMNode *)this_local;
}

Assistant:

DOMNode *DOMNodeListImpl::item(XMLSize_t index) const{
    if (fNode) {
        DOMNode *node = fNode->fFirstChild;
        for(XMLSize_t i=0; i<index && node!=0; ++i)
            node = castToChildImpl(node)->nextSibling;
        return node;
    }
    return 0;
}